

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O1

void __thiscall
asio::detail::
wait_handler<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor>
::wait_handler(wait_handler<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor>
               *this,_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
                     *h,any_io_executor *io_ex)

{
  undefined8 uVar1;
  error_category *peVar2;
  
  (this->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (this->super_wait_op).super_operation.func_ = do_complete;
  (this->super_wait_op).super_operation.task_result_ = 0;
  (this->super_wait_op).ec_._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  (this->super_wait_op).ec_._M_cat = peVar2;
  (this->super_wait_op).cancellation_key_ = (void *)0x0;
  uVar1 = *(undefined8 *)&h->field_0x8;
  (this->handler_)._M_f = h->_M_f;
  *(undefined8 *)&(this->handler_).field_0x8 = uVar1;
  (this->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_nuraft::asio_service_impl_*,_false>._M_head_impl =
       (h->_M_bound_args).super__Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_nuraft::asio_service_impl_*,_false>._M_head_impl;
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
  handler_work_base(&(this->work_).
                     super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                    ,0,0,io_ex);
  return;
}

Assistant:

wait_handler(Handler& h, const IoExecutor& io_ex)
    : wait_op(&wait_handler::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(h)),
      work_(handler_, io_ex)
  {
  }